

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osgen3.c
# Opt level: O0

void osgen_gridwin_clear_ptr(char *txtp,osgen_charcolor_t *colorp,size_t len)

{
  size_t len_local;
  osgen_charcolor_t *colorp_local;
  char *txtp_local;
  
  colorp_local = colorp;
  txtp_local = txtp;
  for (len_local = len; len_local != 0; len_local = len_local - 1) {
    *txtp_local = ' ';
    colorp_local->fg = '\x02';
    colorp_local->bg = '\x01';
    txtp_local = txtp_local + 1;
    colorp_local = colorp_local + 1;
  }
  return;
}

Assistant:

static void osgen_gridwin_clear_ptr(char *txtp, osgen_charcolor_t *colorp,
                                    size_t len)
{
    /* loop through the grid from the starting offset */
    for ( ; len != 0 ; --len, ++txtp, ++colorp)
    {
        /* set this character's text to a space */
        *txtp = ' ';

        /* set this character's color to text/transparent */
        colorp->fg = OSGEN_COLOR_TEXT;
        colorp->bg = OSGEN_COLOR_TRANSPARENT;
    }
}